

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testaniminter.cpp
# Opt level: O0

int main(void)

{
  ushort uVar1;
  ushort uVar2;
  ostream *poVar3;
  Am_Wrapper *pAVar4;
  Am_Object AVar5;
  Am_Object *pAVar6;
  Am_Method_Wrapper *pAVar7;
  undefined8 uVar8;
  Am_Value_List *pAVar9;
  Am_Value *pAVar10;
  Am_Object local_280;
  uint local_274;
  Am_Object local_270;
  Am_Object local_268;
  Am_Object local_260;
  uint local_254;
  Am_Object local_250;
  Am_Object local_248;
  Am_Object local_240;
  uint local_234;
  Am_Object local_230;
  Am_Object local_228;
  Am_Object local_220;
  uint local_214;
  Am_Object local_210;
  Am_Object local_208;
  Am_Object local_200;
  uint local_1f4;
  Am_Object local_1f0;
  Am_Object local_1e8;
  Am_Object local_1e0;
  uint local_1d4;
  Am_Object local_1d0;
  Am_Object local_1c8;
  Am_Object local_1c0;
  Am_Object local_1b8;
  Am_Object local_1b0;
  Am_Object cmd;
  Am_Object local_1a0;
  Am_Object how_set_inter;
  Am_Time local_190 [8];
  Am_Object local_188;
  Am_Object local_180;
  Am_Value_List local_178 [16];
  Am_Object local_168;
  Am_Object local_160;
  Am_Time local_158 [8];
  Am_Object local_150;
  Am_Object local_148;
  Am_Time local_140 [8];
  Am_Value_List local_138 [16];
  Am_Value_List local_128 [16];
  Am_Value_List local_118 [16];
  Am_Object local_108;
  Am_Object local_100;
  Am_Object local_f8;
  Am_Object local_f0;
  Am_Value local_e8;
  Am_Object local_d8;
  Am_Object local_d0;
  Am_Object local_c8;
  Am_Object local_c0;
  Am_Value local_b8;
  Am_Object local_a8;
  Am_Object local_a0;
  Am_Object local_98;
  Am_Object local_90;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30 [3];
  Am_Object local_18;
  int local_c;
  
  local_c = 0;
  poVar3 = std::operator<<((ostream *)&std::cout,"General initialize\n");
  std::ostream::operator<<((ostream *)poVar3,std::flush<char,std::char_traits<char>>);
  Am_Initialize();
  Am_Object::Create((char *)&local_18);
  uVar1 = Am_Object::Set((ushort)&local_18,(char *)0x6c,0x109181);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  uVar1 = Am_Object::Set(uVar1,100,0x14);
  uVar1 = Am_Object::Set(uVar1,0x65,0x14);
  uVar1 = Am_Object::Set(uVar1,0x66,500);
  uVar1 = Am_Object::Set(uVar1,0x67,0x136);
  AVar5.data = (Am_Object_Data *)Am_Object::Set(uVar1,true,1);
  Am_Object::Create((char *)&local_38);
  uVar1 = Am_Object::Set((ushort)&local_38,100,10);
  uVar1 = Am_Object::Set(uVar1,0x65,10);
  uVar1 = Am_Object::Set(uVar1,0x66,0x28);
  uVar1 = Am_Object::Set(uVar1,0x67,0x28);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  pAVar6 = (Am_Object *)Am_Object::operator=(&rect1,pAVar6);
  Am_Object::Am_Object(local_30,pAVar6);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(local_30,0),1);
  Am_Object::Create((char *)&local_48);
  uVar1 = Am_Object::Set((ushort)&local_48,100,0x3c);
  uVar1 = Am_Object::Set(uVar1,0x65,10);
  uVar1 = Am_Object::Set(uVar1,0x66,0x28);
  uVar1 = Am_Object::Set(uVar1,0x67,0x28);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  pAVar6 = (Am_Object *)Am_Object::operator=(&rect2,pAVar6);
  Am_Object::Am_Object(&local_40,pAVar6);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_40,0),1);
  Am_Object::Create((char *)&local_58);
  uVar1 = Am_Object::Set((ushort)&local_58,100,0x6e);
  uVar1 = Am_Object::Set(uVar1,0x65,10);
  uVar1 = Am_Object::Set(uVar1,0x66,0x28);
  uVar1 = Am_Object::Set(uVar1,0x67,0x28);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  pAVar6 = (Am_Object *)Am_Object::operator=(&rect3,pAVar6);
  Am_Object::Am_Object(&local_50,pAVar6);
  AVar5.data = (Am_Object_Data *)Am_Object::Add_Part(AVar5,SUB81(&local_50,0),1);
  Am_Object::Create((char *)&local_68);
  uVar1 = Am_Object::Set((ushort)&local_68,100,0xa0);
  uVar1 = Am_Object::Set(uVar1,0x65,10);
  uVar1 = Am_Object::Set(uVar1,0x66,0x28);
  uVar1 = Am_Object::Set(uVar1,0x67,0x28);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Orange);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6a,(ulong)pAVar4);
  pAVar6 = (Am_Object *)Am_Object::operator=(&rect4,pAVar6);
  Am_Object::Am_Object(&local_60,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Add_Part(AVar5,SUB81(&local_60,0),1);
  Am_Object::operator=(&window,pAVar6);
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_40);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(local_30);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_18);
  Am_Object::Create((char *)&local_78);
  uVar1 = Am_Object::Set((ushort)&local_78,true,1);
  Am_Object::Create((char *)&local_88);
  pAVar6 = (Am_Object *)Am_Object::Set((ushort)&local_88,0xeb,0x67);
  Am_Object::Am_Object(&local_80,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar1,(Am_Object)0xc5,(ulong)&local_80);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim1,pAVar6);
  Am_Object::Am_Object(&local_70,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10c318,SUB81(&local_70,0),1);
  Am_Object::~Am_Object(&local_70);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_78);
  Am_Object::Create((char *)&local_98);
  uVar1 = Am_Object::Set((ushort)&local_98,true,1);
  Am_Object::Create((char *)&local_a8);
  uVar2 = Am_Object::Set((ushort)&local_a8,0x11d,2);
  uVar2 = Am_Object::Set(uVar2,0x11e,3);
  Am_Animation_End_Action::operator_cast_to_Am_Value((Am_Animation_End_Action *)&local_b8);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Value *)0xf0,(ulong)&local_b8);
  Am_Object::Am_Object(&local_a0,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar1,(Am_Object)0xc5,(ulong)&local_a0);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim2,pAVar6);
  Am_Object::Am_Object(&local_90,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10c320,SUB81(&local_90,0),1);
  Am_Object::~Am_Object(&local_90);
  Am_Object::~Am_Object(&local_a0);
  Am_Value::~Am_Value(&local_b8);
  Am_Object::~Am_Object(&local_a8);
  Am_Object::~Am_Object(&local_98);
  Am_Object::Create((char *)&local_c8);
  uVar1 = Am_Object::Set((ushort)&local_c8,true,1);
  Am_Object::Create((char *)&local_d8);
  uVar2 = Am_Object::Set((ushort)&local_d8,0x11d,0xfffffffc);
  uVar2 = Am_Object::Set(uVar2,0x11e,4);
  Am_Animation_End_Action::operator_cast_to_Am_Value((Am_Animation_End_Action *)&local_e8);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Value *)0xf0,(ulong)&local_e8);
  Am_Object::Am_Object(&local_d0,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar1,(Am_Object)0xc5,(ulong)&local_d0);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim3,pAVar6);
  Am_Object::Am_Object(&local_c0,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10c328,SUB81(&local_c0,0),1);
  Am_Object::~Am_Object(&local_c0);
  Am_Object::~Am_Object(&local_d0);
  Am_Value::~Am_Value(&local_e8);
  Am_Object::~Am_Object(&local_d8);
  Am_Object::~Am_Object(&local_c8);
  Am_Object::Create((char *)&local_f8);
  Am_Object::Create((char *)&local_108);
  pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&my_do);
  uVar1 = Am_Object::Set((ushort)&local_108,(Am_Method_Wrapper *)0xca,(ulong)pAVar7);
  Am_Value_List::Am_Value_List(local_118);
  uVar8 = Am_Value_List::Add(local_118,100,1);
  pAVar9 = (Am_Value_List *)Am_Value_List::Add(uVar8,0x65,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar9);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0xeb,(ulong)pAVar4);
  Am_Value_List::Am_Value_List(local_128);
  uVar8 = Am_Value_List::Add(local_128,0xa0,1);
  pAVar9 = (Am_Value_List *)Am_Value_List::Add(uVar8,10,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar9);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x181,(ulong)pAVar4);
  Am_Value_List::Am_Value_List(local_138);
  uVar8 = Am_Value_List::Add(local_138,0x1a4,1);
  pAVar9 = (Am_Value_List *)Am_Value_List::Add(uVar8,0x104,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar9);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x182,(ulong)pAVar4);
  Am_Time::Am_Time(local_140,10000);
  pAVar4 = Am_Time::operator_cast_to_Am_Wrapper_(local_140);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0xec,(ulong)pAVar4);
  Am_Object::Am_Object(&local_100,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part((ushort)&local_f8,(Am_Object)0xc5,(ulong)&local_100);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim4,pAVar6);
  Am_Object::Am_Object(&local_f0,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10c330,SUB81(&local_f0,0),1);
  Am_Object::~Am_Object(&local_f0);
  Am_Object::~Am_Object(&local_100);
  Am_Time::~Am_Time(local_140);
  Am_Value_List::~Am_Value_List(local_138);
  Am_Value_List::~Am_Value_List(local_128);
  Am_Value_List::~Am_Value_List(local_118);
  Am_Object::~Am_Object(&local_108);
  Am_Object::~Am_Object(&local_f8);
  Am_Object::Create((char *)&local_150);
  Am_Time::Am_Time(local_158,500);
  pAVar4 = Am_Time::operator_cast_to_Am_Wrapper_(local_158);
  uVar1 = Am_Object::Set((ushort)&local_150,(Am_Wrapper *)0xe9,(ulong)pAVar4);
  Am_Object::Create((char *)&local_168);
  uVar2 = Am_Object::Set((ushort)&local_168,0xeb,0x6a);
  Am_Value_List::Am_Value_List(local_178);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Red);
  uVar8 = Am_Value_List::Add(local_178,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Blue);
  uVar8 = Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Cyan);
  uVar8 = Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Purple);
  uVar8 = Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Orange);
  uVar8 = Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Green);
  uVar8 = Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Yellow);
  uVar8 = Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Black);
  uVar8 = Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_White);
  uVar8 = Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
  uVar8 = Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Gray);
  uVar8 = Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Blue);
  uVar8 = Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Green);
  uVar8 = Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Motif_Light_Orange);
  pAVar9 = (Am_Value_List *)Am_Value_List::Add(uVar8,pAVar4,1);
  pAVar4 = Am_Value_List::operator_cast_to_Am_Wrapper_(pAVar9);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar2,(Am_Wrapper *)0xed,(ulong)pAVar4);
  Am_Object::Am_Object(&local_160,pAVar6);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar1,(Am_Object)0xc5,(ulong)&local_160);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim5,pAVar6);
  Am_Object::Am_Object(&local_148,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10c318,SUB81(&local_148,0),1);
  Am_Object::~Am_Object(&local_148);
  Am_Object::~Am_Object(&local_160);
  Am_Value_List::~Am_Value_List(local_178);
  Am_Object::~Am_Object(&local_168);
  Am_Time::~Am_Time(local_158);
  Am_Object::~Am_Object(&local_150);
  Am_Object::Create((char *)&local_188);
  Am_Time::Am_Time(local_190,500);
  pAVar4 = Am_Time::operator_cast_to_Am_Wrapper_(local_190);
  uVar1 = Am_Object::Set((ushort)&local_188,(Am_Wrapper *)0xe9,(ulong)pAVar4);
  uVar1 = Am_Object::Set(uVar1,true,1);
  Am_Object::Create((char *)&how_set_inter);
  pAVar6 = (Am_Object *)Am_Object::Set_Part(uVar1,(Am_Object)0xc5,(ulong)&how_set_inter);
  pAVar6 = (Am_Object *)Am_Object::operator=(&anim6,pAVar6);
  Am_Object::Am_Object(&local_180,pAVar6);
  Am_Object::Add_Part((Am_Object)0x10c328,SUB81(&local_180,0),1);
  Am_Object::~Am_Object(&local_180);
  Am_Object::~Am_Object(&how_set_inter);
  Am_Time::~Am_Time(local_190);
  Am_Object::~Am_Object(&local_188);
  poVar3 = std::operator<<((ostream *)&std::cout,
                           "first one gets taller and changes color, blue bounces,\n");
  poVar3 = std::operator<<(poVar3,"green wraps and blinks, orange goes to corner and stops\n");
  std::ostream::operator<<((ostream *)poVar3,std::flush<char,std::char_traits<char>>);
  Am_Object::Create((char *)&cmd);
  uVar1 = Am_Object::Set((ushort)&cmd,0xcd,200);
  pAVar6 = (Am_Object *)Am_Object::Set(uVar1,(char *)0xb9,0x10924d);
  Am_Object::Am_Object(&local_1a0,pAVar6);
  Am_Object::~Am_Object(&cmd);
  Am_Object::Am_Object(&local_1b0);
  pAVar10 = (Am_Value *)Am_Object::Get((ushort)&local_1a0,0xc5);
  Am_Object::operator=(&local_1b0,pAVar10);
  pAVar7 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&change_setting);
  Am_Object::Set((ushort)&local_1b0,(Am_Method_Wrapper *)0xca,(ulong)pAVar7);
  Am_Object::Am_Object(&local_1b8,&local_1a0);
  Am_Object::Add_Part((Am_Object)0x10c310,SUB81(&local_1b8,0),1);
  Am_Object::~Am_Object(&local_1b8);
  Am_Object::Am_Object(&local_1c0,&window);
  Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_1c0,0),1);
  Am_Object::~Am_Object(&local_1c0);
  poVar3 = std::operator<<((ostream *)&std::cout,"Loading pixmaps\n");
  std::ostream::operator<<((ostream *)poVar3,std::flush<char,std::char_traits<char>>);
  init_pixmaps();
  poVar3 = std::operator<<((ostream *)&std::cout,"Starting interactors\n");
  std::ostream::operator<<((ostream *)poVar3,std::flush<char,std::char_traits<char>>);
  Am_Object::Am_Object(&local_1c8,&anim1);
  Am_Object::Am_Object(&local_1d0,(Am_Object *)&Am_No_Object);
  local_1d4 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_1e0,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_1c8,(Am_Object_Data *)&local_1d0,
                      (Am_Input_Char *)(ulong)local_1d4,(Am_Object_Data *)&local_1e0,0,0,true);
  Am_Object::~Am_Object(&local_1e0);
  Am_Object::~Am_Object(&local_1d0);
  Am_Object::~Am_Object(&local_1c8);
  Am_Object::Am_Object(&local_1e8,&anim2);
  Am_Object::Am_Object(&local_1f0,(Am_Object *)&Am_No_Object);
  local_1f4 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_200,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_1e8,(Am_Object_Data *)&local_1f0,
                      (Am_Input_Char *)(ulong)local_1f4,(Am_Object_Data *)&local_200,0,0,true);
  Am_Object::~Am_Object(&local_200);
  Am_Object::~Am_Object(&local_1f0);
  Am_Object::~Am_Object(&local_1e8);
  Am_Object::Am_Object(&local_208,&anim3);
  Am_Object::Am_Object(&local_210,(Am_Object *)&Am_No_Object);
  local_214 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_220,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_208,(Am_Object_Data *)&local_210,
                      (Am_Input_Char *)(ulong)local_214,(Am_Object_Data *)&local_220,0,0,true);
  Am_Object::~Am_Object(&local_220);
  Am_Object::~Am_Object(&local_210);
  Am_Object::~Am_Object(&local_208);
  Am_Object::Am_Object(&local_228,&anim4);
  Am_Object::Am_Object(&local_230,(Am_Object *)&Am_No_Object);
  local_234 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_240,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_228,(Am_Object_Data *)&local_230,
                      (Am_Input_Char *)(ulong)local_234,(Am_Object_Data *)&local_240,0,0,true);
  Am_Object::~Am_Object(&local_240);
  Am_Object::~Am_Object(&local_230);
  Am_Object::~Am_Object(&local_228);
  Am_Object::Am_Object(&local_248,&anim5);
  Am_Object::Am_Object(&local_250,(Am_Object *)&Am_No_Object);
  local_254 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_260,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_248,(Am_Object_Data *)&local_250,
                      (Am_Input_Char *)(ulong)local_254,(Am_Object_Data *)&local_260,0,0,true);
  Am_Object::~Am_Object(&local_260);
  Am_Object::~Am_Object(&local_250);
  Am_Object::~Am_Object(&local_248);
  Am_Object::Am_Object(&local_268,&anim6);
  Am_Object::Am_Object(&local_270,(Am_Object *)&Am_No_Object);
  local_274 = _Am_Default_Start_Char;
  Am_Object::Am_Object(&local_280,(Am_Object *)&Am_No_Object);
  Am_Start_Interactor((Am_Object_Data *)&local_268,(Am_Object_Data *)&local_270,
                      (Am_Input_Char *)(ulong)local_274,(Am_Object_Data *)&local_280,0,0,true);
  Am_Object::~Am_Object(&local_280);
  Am_Object::~Am_Object(&local_270);
  Am_Object::~Am_Object(&local_268);
  Am_Main_Event_Loop();
  Am_Cleanup();
  local_c = 0;
  Am_Object::~Am_Object(&local_1b0);
  Am_Object::~Am_Object(&local_1a0);
  return local_c;
}

Assistant:

int
main()
{
  std::cout << "General initialize\n" << std::flush;
  Am_Initialize();

  window = Am_Window.Create("window")
               .Set(Am_TITLE, "Test Animation")
               .Set(Am_FILL_STYLE, Am_Yellow)
               .Set(Am_LEFT, 20)
#ifndef _MACINTOSH
               .Set(Am_TOP, 20)
#else
               .Set(Am_TOP, 50)
#endif
               .Set(Am_WIDTH, 500)
               .Set(Am_HEIGHT, 310)
               .Set(Am_DOUBLE_BUFFER, true)
               .Add_Part(rect1 = Am_Rectangle.Create("rect1")
                                     .Set(Am_LEFT, 10)
                                     .Set(Am_TOP, 10)
                                     .Set(Am_WIDTH, 40)
                                     .Set(Am_HEIGHT, 40)
                                     .Set(Am_FILL_STYLE, Am_Red))

               .Add_Part(rect2 = Am_Rectangle.Create("rect2")
                                     .Set(Am_LEFT, 60)
                                     .Set(Am_TOP, 10)
                                     .Set(Am_WIDTH, 40)
                                     .Set(Am_HEIGHT, 40)
                                     .Set(Am_FILL_STYLE, Am_Blue))
               .Add_Part(rect3 = Am_Rectangle.Create("rect3")
                                     .Set(Am_LEFT, 110)
                                     .Set(Am_TOP, 10)
                                     .Set(Am_WIDTH, 40)
                                     .Set(Am_HEIGHT, 40)
                                     .Set(Am_FILL_STYLE, Am_Green))
               .Add_Part(rect4 = Am_Rectangle.Create("rect4")
                                     .Set(Am_LEFT, 160)
                                     .Set(Am_TOP, 10)
                                     .Set(Am_WIDTH, 40)
                                     .Set(Am_HEIGHT, 40)
                                     .Set(Am_FILL_STYLE, Am_Orange));

  rect1.Add_Part(
      anim1 = Am_Animation_Interactor.Create("anim1")
                  .Set(Am_START_WHEN, true)
                  .Set_Part(Am_COMMAND,
                            Am_Incrementer_Animation_Command.Create().Set(
                                Am_SLOT_TO_ANIMATE, Am_HEIGHT)));

  rect2.Add_Part(
      anim2 =
          Am_Animation_Interactor.Create("anim2")
              .Set(Am_START_WHEN, true)
              .Set_Part(Am_COMMAND,
                        Am_Animation_Object_In_Owner_Command.Create()
                            .Set(Am_X_OFFSET, 2)
                            .Set(Am_Y_OFFSET, 3)
                            .Set(Am_ANIMATE_END_ACTION, Am_ANIMATION_BOUNCE)));

  rect3.Add_Part(
      anim3 =
          Am_Animation_Interactor.Create("anim3")
              .Set(Am_START_WHEN, true)
              .Set_Part(Am_COMMAND,
                        Am_Animation_Object_In_Owner_Command.Create()
                            .Set(Am_X_OFFSET, -4)
                            .Set(Am_Y_OFFSET, 4)
                            .Set(Am_ANIMATE_END_ACTION, Am_ANIMATION_WRAP)));

  rect4.Add_Part(
      anim4 = Am_Animation_Interactor.Create("anim4").Set_Part(
          Am_COMMAND,
          Am_Animator_Animation_Command.Create()
              .Set(Am_DO_METHOD, my_do)
              .Set(Am_SLOT_TO_ANIMATE, Am_Value_List().Add(Am_LEFT).Add(Am_TOP))
              .Set(Am_VALUE_1, Am_Value_List().Add(160).Add(10))
              .Set(Am_VALUE_2, Am_Value_List().Add(420).Add(260))
              .Set(Am_TIME_FOR_ANIMATION, Am_Time(10000)) //milliseconds
          ));
  rect1.Add_Part(
      anim5 =
          Am_Animation_Interactor
              .Create("anim5")
              //change every 1/2 second
              .Set(Am_REPEAT_DELAY, Am_Time(500))
              .Set_Part(Am_COMMAND, Am_Animation_Through_List_Command.Create()
                                        .Set(Am_SLOT_TO_ANIMATE, Am_FILL_STYLE)
                                        .Set(Am_VALUES_FOR_SLOT_TO_ANIMATE,
                                             Am_Value_List()
                                                 .Add(Am_Red)
                                                 .Add(Am_Blue)
                                                 .Add(Am_Cyan)
                                                 .Add(Am_Purple)
                                                 .Add(Am_Orange)
                                                 .Add(Am_Green)
                                                 .Add(Am_Yellow)
                                                 .Add(Am_Black)
                                                 .Add(Am_White)
                                                 .Add(Am_Amulet_Purple)
                                                 .Add(Am_Motif_Light_Gray)
                                                 .Add(Am_Motif_Light_Blue)
                                                 .Add(Am_Motif_Light_Green)
                                                 .Add(Am_Motif_Light_Orange))));
  rect3.Add_Part(
      anim6 = Am_Animation_Interactor
                  .Create("anim6")
                  //change every 1/2 second
                  .Set(Am_REPEAT_DELAY, Am_Time(500))
                  .Set(Am_START_WHEN, true)
                  .Set_Part(Am_COMMAND, Am_Animation_Blink_Command.Create()));

  std::cout << "first one gets taller and changes color, blue bounces,\n"
            << "green wraps and blinks, orange goes to corner and stops\n"
            << std::flush;

  Am_Object how_set_inter =
      Am_One_Shot_Interactor.Create("change_settings")
          .Set(Am_PRIORITY, 200) //higher than normal running
          .Set(Am_START_WHEN, "ANY_KEYBOARD");
  Am_Object cmd;
  cmd = how_set_inter.Get(Am_COMMAND);
  cmd.Set(Am_DO_METHOD, change_setting);
  window.Add_Part(how_set_inter);
  Am_Screen.Add_Part(window);

  std::cout << "Loading pixmaps\n" << std::flush;
  init_pixmaps();

  std::cout << "Starting interactors\n" << std::flush;

  Am_Start_Interactor(anim1);
  Am_Start_Interactor(anim2);
  Am_Start_Interactor(anim3);
  Am_Start_Interactor(anim4);
  Am_Start_Interactor(anim5);
  Am_Start_Interactor(anim6);

  Am_Main_Event_Loop();
  Am_Cleanup();

  return 0;
}